

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  int8_t *piVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  int32_t *piVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int16_t *piVar12;
  int *piVar13;
  __m128i round;
  undefined1 auVar14 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i in [512];
  undefined1 auStack_2118 [16];
  undefined1 auStack_2108 [16];
  undefined1 auStack_20f8 [16];
  undefined1 auStack_20e8 [16];
  undefined1 auStack_20d8 [16];
  undefined1 auStack_20c8 [16];
  undefined1 auStack_20b8 [16];
  undefined1 auStack_20a8 [16];
  undefined1 auStack_2098 [16];
  undefined1 auStack_2088 [16];
  undefined1 auStack_2078 [16];
  int aiStack_2068 [8];
  undefined1 auStack_2048 [16];
  undefined1 auStack_2038 [8];
  undefined8 uStack_2030;
  undefined8 local_2028;
  int aiStack_2020 [2046];
  
  piVar4 = av1_fwd_txfm_shift_ls[0xc];
  uVar10 = (uint)(byte)*av1_fwd_txfm_shift_ls[0xc];
  piVar12 = input + 0x3c;
  lVar7 = 0xf0;
  do {
    auVar15 = pmovsxwd(in_XMM1,*(undefined8 *)(piVar12 + -0x3c));
    auVar16 = pmovsxwd(in_XMM2,*(undefined8 *)(piVar12 + -0x38));
    auVar20 = pmovsxwd(in_XMM3,*(undefined8 *)(piVar12 + -0x34));
    auVar27 = pmovsxwd(in_XMM4,*(undefined8 *)(piVar12 + -0x30));
    uVar9 = (uint)(char)uVar10;
    auVar17._0_4_ = auVar15._0_4_ << uVar9;
    auVar17._4_4_ = auVar15._4_4_;
    auVar17._8_4_ = auVar15._8_4_;
    auVar17._12_4_ = auVar15._12_4_;
    *(undefined1 (*) [16])(auStack_2118 + lVar7) = auVar17;
    auVar29._0_4_ = auVar16._0_4_ << uVar9;
    auVar29._4_4_ = auVar16._4_4_;
    auVar29._8_4_ = auVar16._8_4_;
    auVar29._12_4_ = auVar16._12_4_;
    *(undefined1 (*) [16])(auStack_2108 + lVar7) = auVar29;
    auVar21._0_4_ = auVar20._0_4_ << uVar9;
    auVar21._4_4_ = auVar20._4_4_;
    auVar21._8_4_ = auVar20._8_4_;
    auVar21._12_4_ = auVar20._12_4_;
    auVar28._0_4_ = auVar27._0_4_ << uVar9;
    auVar28._4_4_ = auVar27._4_4_;
    auVar28._8_4_ = auVar27._8_4_;
    auVar28._12_4_ = auVar27._12_4_;
    *(undefined1 (*) [16])(auStack_20f8 + lVar7) = auVar21;
    *(undefined1 (*) [16])(auStack_20e8 + lVar7) = auVar28;
    auVar15 = pmovsxwd(auVar17,*(undefined8 *)(piVar12 + -0x2c));
    auVar17 = pmovsxwd(auVar29,*(undefined8 *)(piVar12 + -0x28));
    auVar20 = pmovsxwd(auVar21,*(undefined8 *)(piVar12 + -0x24));
    auVar29 = pmovsxwd(auVar28,*(undefined8 *)(piVar12 + -0x20));
    auVar16._0_4_ = auVar15._0_4_ << uVar9;
    auVar16._4_4_ = auVar15._4_4_;
    auVar16._8_4_ = auVar15._8_4_;
    auVar16._12_4_ = auVar15._12_4_;
    *(undefined1 (*) [16])(auStack_20d8 + lVar7) = auVar16;
    auVar27._0_4_ = auVar17._0_4_ << uVar9;
    auVar27._4_4_ = auVar17._4_4_;
    auVar27._8_4_ = auVar17._8_4_;
    auVar27._12_4_ = auVar17._12_4_;
    *(undefined1 (*) [16])(auStack_20c8 + lVar7) = auVar27;
    auVar22._0_4_ = auVar20._0_4_ << uVar9;
    auVar22._4_4_ = auVar20._4_4_;
    auVar22._8_4_ = auVar20._8_4_;
    auVar22._12_4_ = auVar20._12_4_;
    auVar30._0_4_ = auVar29._0_4_ << uVar9;
    auVar30._4_4_ = auVar29._4_4_;
    auVar30._8_4_ = auVar29._8_4_;
    auVar30._12_4_ = auVar29._12_4_;
    *(undefined1 (*) [16])(auStack_20b8 + lVar7) = auVar22;
    *(undefined1 (*) [16])(auStack_20a8 + lVar7) = auVar30;
    auVar15 = pmovsxwd(auVar16,*(undefined8 *)(piVar12 + -0x1c));
    auVar17 = pmovsxwd(auVar27,*(undefined8 *)(piVar12 + -0x18));
    auVar16 = pmovsxwd(auVar22,*(undefined8 *)(piVar12 + -0x14));
    auVar29 = pmovsxwd(auVar30,*(undefined8 *)(piVar12 + -0x10));
    auVar20._0_4_ = auVar15._0_4_ << uVar9;
    auVar20._4_4_ = auVar15._4_4_;
    auVar20._8_4_ = auVar15._8_4_;
    auVar20._12_4_ = auVar15._12_4_;
    *(undefined1 (*) [16])(auStack_2098 + lVar7) = auVar20;
    auVar18._0_4_ = auVar17._0_4_ << uVar9;
    auVar18._4_4_ = auVar17._4_4_;
    auVar18._8_4_ = auVar17._8_4_;
    auVar18._12_4_ = auVar17._12_4_;
    *(undefined1 (*) [16])(auStack_2088 + lVar7) = auVar18;
    auVar23._0_4_ = auVar16._0_4_ << uVar9;
    auVar23._4_4_ = auVar16._4_4_;
    auVar23._8_4_ = auVar16._8_4_;
    auVar23._12_4_ = auVar16._12_4_;
    *(undefined1 (*) [16])(auStack_2078 + lVar7) = auVar23;
    *(int *)((long)aiStack_2068 + lVar7) = auVar29._0_4_ << uVar9;
    *(int *)((long)aiStack_2068 + lVar7 + 4) = auVar29._4_4_;
    *(int *)((long)aiStack_2068 + lVar7 + 8) = auVar29._8_4_;
    *(int *)((long)aiStack_2068 + lVar7 + 0xc) = auVar29._12_4_;
    uVar10 = (uint)*av1_fwd_txfm_shift_ls[0xc];
    auVar15 = pmovsxwd(ZEXT416(uVar9),*(undefined8 *)(piVar12 + -0xc));
    auVar17 = pmovsxwd(auVar20,*(undefined8 *)(piVar12 + -8));
    auVar16 = pmovsxwd(auVar18,*(undefined8 *)(piVar12 + -4));
    auVar20 = pmovsxwd(auVar23,*(undefined8 *)piVar12);
    in_XMM4 = ZEXT416(uVar10);
    *(int *)((long)aiStack_2068 + lVar7 + 0x10) = auVar15._0_4_ << uVar10;
    *(int *)((long)aiStack_2068 + lVar7 + 0x14) = auVar15._4_4_;
    *(int *)((long)aiStack_2068 + lVar7 + 0x18) = auVar15._8_4_;
    *(int *)((long)aiStack_2068 + lVar7 + 0x1c) = auVar15._12_4_;
    in_XMM1._0_4_ = auVar17._0_4_ << uVar10;
    in_XMM1._4_4_ = auVar17._4_4_;
    in_XMM1._8_4_ = auVar17._8_4_;
    in_XMM1._12_4_ = auVar17._12_4_;
    in_XMM2._0_4_ = auVar16._0_4_ << uVar10;
    in_XMM2._4_4_ = auVar16._4_4_;
    in_XMM2._8_4_ = auVar16._8_4_;
    in_XMM2._12_4_ = auVar16._12_4_;
    *(undefined1 (*) [16])(auStack_2048 + lVar7) = in_XMM1;
    *(undefined1 (*) [16])(auStack_2038 + lVar7) = in_XMM2;
    in_XMM3._0_4_ = auVar20._0_4_ << uVar10;
    in_XMM3._4_4_ = auVar20._4_4_;
    in_XMM3._8_4_ = auVar20._8_4_;
    in_XMM3._12_4_ = auVar20._12_4_;
    *(undefined1 (*) [16])((long)&local_2028 + lVar7) = in_XMM3;
    piVar12 = piVar12 + stride;
    lVar7 = lVar7 + 0x100;
  } while (lVar7 != 0x20f0);
  lVar7 = 0;
  do {
    uStack_2030 = 0x42712c;
    av1_fdct32_sse4_1((__m128i *)((long)&local_2028 + lVar7),(__m128i *)((long)&local_2028 + lVar7),
                      0xc,0x10);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x100);
  cVar2 = piVar4[1];
  lVar7 = 0;
  do {
    uStack_2030 = 0x42714e;
    col_txfm_16x16_rounding((__m128i *)((long)&local_2028 + lVar7),-(int)cVar2);
    lVar7 = lVar7 + 0x400;
  } while (lVar7 != 0x2000);
  piVar6 = aiStack_2020 + 0xbe;
  piVar8 = coeff + 0x60;
  lVar7 = 0;
  do {
    lVar11 = -0x80;
    piVar13 = piVar6;
    do {
      auVar15 = *(undefined1 (*) [16])(piVar13 + -0xc0);
      auVar17 = *(undefined1 (*) [16])(piVar13 + -0x40);
      auVar24._0_8_ = auVar15._0_8_;
      auVar24._8_4_ = auVar15._4_4_;
      auVar24._12_4_ = piVar13[-0x7f];
      auVar14._0_8_ = CONCAT44(piVar13[-0x7e],auVar15._8_4_);
      auVar14._8_4_ = auVar15._12_4_;
      auVar14._12_4_ = piVar13[-0x7d];
      iVar5 = *piVar13;
      auVar31._0_8_ = auVar17._0_8_;
      auVar31._8_4_ = auVar17._4_4_;
      auVar31._12_4_ = piVar13[1];
      auVar19._0_8_ = CONCAT44(piVar13[2],auVar17._8_4_);
      auVar19._8_4_ = auVar17._12_4_;
      auVar19._12_4_ = piVar13[3];
      puVar1 = (undefined8 *)((long)piVar8 + lVar11 + -0x100);
      *puVar1 = CONCAT44(piVar13[-0x80],auVar15._0_4_);
      puVar1[1] = CONCAT44(iVar5,auVar17._0_4_);
      auVar25._8_8_ = auVar31._8_8_;
      auVar25._0_8_ = auVar24._8_8_;
      *(undefined1 (*) [16])((long)piVar8 + lVar11 + -0x80) = auVar25;
      auVar15._8_8_ = auVar19._0_8_;
      auVar15._0_8_ = auVar14._0_8_;
      *(undefined1 (*) [16])((long)piVar8 + lVar11) = auVar15;
      puVar1 = (undefined8 *)((long)piVar8 + lVar11 + 0x80);
      *puVar1 = auVar14._8_8_;
      puVar1[1] = auVar19._8_8_;
      piVar13 = piVar13 + 0x100;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0);
    lVar7 = lVar7 + 1;
    piVar6 = piVar6 + 4;
    piVar8 = piVar8 + 0x80;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uStack_2030 = 0x427228;
    av1_fdct64_sse4_1((__m128i *)((long)coeff + lVar7),(__m128i *)((long)&local_2028 + lVar7),'\v',8
                      ,8);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x80);
  bVar3 = piVar4[2];
  if ((char)bVar3 < '\0') {
    iVar5 = 1 << (~bVar3 & 0x1f);
    lVar7 = 0;
    auVar15 = ZEXT416((uint)-(int)(char)bVar3);
    auVar17 = pmovsxwd(auVar19,0x16a116a116a116a1);
    auVar16 = pmovsxwd(auVar25,0x800080008000800);
    do {
      auVar32._0_4_ = *(int *)((long)&local_2028 + lVar7) + iVar5 >> auVar15;
      auVar32._4_4_ = *(int *)((long)aiStack_2020 + lVar7 + -4) + iVar5 >> auVar15;
      auVar32._8_4_ = *(int *)((long)aiStack_2020 + lVar7) + iVar5 >> auVar15;
      auVar32._12_4_ = *(int *)((long)aiStack_2020 + lVar7 + 4) + iVar5 >> auVar15;
      auVar20 = pmulld(auVar32,auVar17);
      piVar6 = (int *)((long)coeff + lVar7);
      *piVar6 = auVar20._0_4_ + auVar16._0_4_ >> 0xc;
      piVar6[1] = auVar20._4_4_ + auVar16._4_4_ >> 0xc;
      piVar6[2] = auVar20._8_4_ + auVar16._8_4_ >> 0xc;
      piVar6[3] = auVar20._12_4_ + auVar16._12_4_ >> 0xc;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x2000);
  }
  else {
    lVar7 = 0;
    auVar15 = pmovsxwd(auVar15,0x16a116a116a116a1);
    auVar17 = pmovsxwd(auVar19,0x800080008000800);
    do {
      auVar26._0_4_ = *(int *)((long)&local_2028 + lVar7) << (int)(char)bVar3;
      auVar26._4_4_ = *(undefined4 *)((long)aiStack_2020 + lVar7 + -4);
      auVar26._8_4_ = *(undefined4 *)((long)aiStack_2020 + lVar7);
      auVar26._12_4_ = *(undefined4 *)((long)aiStack_2020 + lVar7 + 4);
      auVar16 = pmulld(auVar26,auVar15);
      piVar6 = (int *)((long)coeff + lVar7);
      *piVar6 = auVar16._0_4_ + auVar17._0_4_ >> 0xc;
      piVar6[1] = auVar16._4_4_ + auVar17._4_4_ >> 0xc;
      piVar6[2] = auVar16._8_4_ + auVar17._8_4_ >> 0xc;
      piVar6[3] = auVar16._12_4_ + auVar17._12_4_ >> 0xc;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x2000);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X32];
  const int txw_idx = get_txw_idx(TX_64X32);
  const int txh_idx = get_txh_idx(TX_64X32);
  const int txfm_size_col = tx_size_wide[TX_64X32];
  const int txfm_size_row = tx_size_high[TX_64X32];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  for (int i = 0; i < 32; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * 16, 4, 0, 0, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * 16, 4, 0, 0,
                    shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct32_sse4_1((in + i), (in + i), bitcol, num_col);
  }

  for (int i = 0; i < num_row; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_col), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct64_sse4_1((outcoef128 + i), (in + i), bitrow, num_row, num_row);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 512, -shift[2],
                                       NewSqrt2);
  (void)bd;
}